

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_int_base.cpp
# Opt level: O3

string * __thiscall
sc_dt::sc_int_base::to_string_abi_cxx11_
          (string *__return_storage_ptr__,sc_int_base *this,sc_numrep numrep,bool w_prefix)

{
  word *array;
  sc_fix aa;
  sc_fxcast_switch local_6c;
  sc_fxnum local_68;
  sc_fxtype_params local_34;
  
  local_34.m_wl = this->m_len;
  local_6c.m_sw = SC_ON;
  if (0 < local_34.m_wl) {
    local_34.m_q_mode = SC_TRN;
    local_34.m_o_mode = SC_WRAP;
    local_34.m_n_bits = 0;
    local_34.m_iwl = local_34.m_wl;
    sc_fxnum::sc_fxnum(&local_68,this,&local_34,SC_TC_,&local_6c,(sc_fxnum_observer *)0x0);
    sc_fxnum::to_string_abi_cxx11_(__return_storage_ptr__,&local_68,numrep,w_prefix);
    if ((local_68.m_rep != (scfx_rep *)0x0) &&
       (array = ((local_68.m_rep)->m_mant).m_array, array != (word *)0x0)) {
      scfx_mant::free_word(array,(long)((local_68.m_rep)->m_mant).m_size);
    }
    scfx_rep::operator_delete(local_68.m_rep,0x28);
    return __return_storage_ptr__;
  }
  sc_core::sc_report_handler::report
            (SC_ERROR,"total wordlength <= 0 is not valid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/fx/sc_fxtype_params.h"
             ,0xb4);
  sc_core::sc_abort();
}

Assistant:

const std::string
sc_int_base::to_string( sc_numrep numrep, bool w_prefix ) const
{
    int len = m_len;
    sc_fix aa( *this, len, len, SC_TRN, SC_WRAP, 0, SC_ON );
    return aa.to_string( numrep, w_prefix );
}